

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O2

void test_read_set_format(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  archive *_a;
  char *pcVar4;
  time_t tVar5;
  int64_t iVar6;
  ssize_t sVar7;
  char test_txt [21];
  archive_entry *ae;
  char buff [64];
  char reffile [25];
  
  builtin_strncpy(reffile + 0x10,"_rar.rar",9);
  builtin_strncpy(reffile,"test_read_format",0x10);
  builtin_strncpy(test_txt,"test text document\r\n",0x15);
  extract_reference_file(reffile);
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\'',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_set_format(_a,L'\x000d0000');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'(',(uint)(wVar1 == L'\0'),
                   "0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR)",_a);
  iVar2 = archive_read_append_filter(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L')',(uint)(iVar2 == 0),
                   "0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE)",_a);
  wVar1 = archive_read_open_filename(_a,reffile,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'*',(uint)(wVar1 == L'\0'),"0 == archive_read_open_filename(a, reffile, 10240)"
                   ,_a);
  iVar2 = archive_read_next_header(_a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'-',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",_a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'.',"test.txt","\"test.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'/',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",_a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'0',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",_a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'1',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",_a);
  iVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'2',0x14,"20",iVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'3',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  sVar7 = archive_read_data(_a,buff,0x14);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'4',(uint)(sVar7 == 0x14),"size == archive_read_data(a, buff, size)",_a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'5',buff,"buff",test_txt,"test_txt",0x14,"size",(void *)0x0);
  iVar2 = archive_read_next_header(_a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'8',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",_a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'9',"testlink","\"testlink\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L':',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",_a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L';',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",_a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'<',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",_a);
  iVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'=',0,"0",iVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'>',0xa1ff,"41471",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  pcVar4 = archive_entry_symlink(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'?',"test.txt","\"test.txt\"",pcVar4,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  sVar7 = archive_read_data(_a,buff,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'@',0,"0",sVar7,"archive_read_data(a, buff, sizeof(buff))",_a);
  iVar2 = archive_read_next_header(_a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'C',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",_a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'D',"testdir/test.txt","\"testdir/test.txt\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'E',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",_a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'F',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",_a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'G',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",_a);
  iVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'H',0x14,"20",iVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'I',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  sVar7 = archive_read_data(_a,buff,0x14);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'J',(uint)(sVar7 == 0x14),"size == archive_read_data(a, buff, size)",_a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'K',buff,"buff",test_txt,"test_txt",0x14,"size",(void *)0x0);
  iVar2 = archive_read_next_header(_a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'N',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",_a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'O',"testdir","\"testdir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'P',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",_a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Q',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",_a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'R',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",_a);
  iVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'S',0,"0",iVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'T',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar2 = archive_read_next_header(_a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'W',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",_a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
             ,L'X',"testemptydir","\"testemptydir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0
             ,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Y',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",_a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Z',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",_a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'[',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",_a);
  iVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\\',0,"0",iVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L']',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar2 = archive_read_next_header(_a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'`',(uint)(iVar2 == 1),"1 == archive_read_next_header(a, &ae)",_a);
  iVar2 = archive_file_count(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'a',5,"5",(long)iVar2,"archive_file_count(a)",(void *)0x0);
  iVar2 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",_a);
  iVar2 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_set_format)
{
  char buff[64];
  const char reffile[] = "test_read_format_rar.rar";
  const char test_txt[] = "test text document\r\n";
  int size = sizeof(test_txt)-1;
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR));
  assertA(0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testlink", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41471, archive_entry_mode(ae));
  assertEqualString("test.txt", archive_entry_symlink(ae));
  assertEqualIntA(a, 0, archive_read_data(a, buff, sizeof(buff)));

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(5, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}